

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O3

wchar_t archive_acl_parse_l(archive_acl *acl,char *text,wchar_t default_type,archive_string_conv *sc
                           )

{
  char cVar1;
  char cVar2;
  int iVar3;
  archive_acl *acl_00;
  byte bVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  ulong uVar7;
  byte *pbVar8;
  archive_acl_entry *paVar9;
  ulong uVar10;
  wchar_t id;
  int iVar11;
  byte *pbVar12;
  int *piVar13;
  char *pcVar14;
  byte *pbVar15;
  wchar_t permset;
  anon_struct_16_2_267fbce2 field [4];
  wchar_t local_b4;
  byte *local_b0;
  byte *local_a8;
  wchar_t local_a0;
  wchar_t local_9c;
  wchar_t local_98;
  wchar_t local_94;
  undefined8 local_90;
  int *local_88 [9];
  archive_string_conv *local_40;
  archive_acl *local_38;
  
  wVar5 = L'\0';
  if ((text != (char *)0x0) && (*text != '\0')) {
    local_90 = 0;
    local_a0 = default_type;
    local_40 = sc;
    local_38 = acl;
    do {
      uVar7 = 0;
      do {
        while ((uVar10 = uVar7, uVar7 = (ulong)(byte)*text, pbVar8 = (byte *)text, uVar7 < 0x21 &&
               ((0x100000600U >> (uVar7 & 0x3f) & 1) != 0))) {
          text = (char *)((byte *)text + 1);
          uVar7 = uVar10;
        }
        while ((bVar4 = (byte)uVar7, 0x3a < bVar4 ||
               (pbVar15 = pbVar8, (0x400100000000401U >> (uVar7 & 0x3f) & 1) == 0))) {
          uVar7 = (ulong)pbVar8[1];
          pbVar8 = pbVar8 + 1;
        }
        do {
          pbVar12 = pbVar15;
          if (0x20 < (ulong)pbVar12[-1]) break;
          pbVar15 = pbVar12 + -1;
        } while ((0x100000600U >> ((ulong)pbVar12[-1] & 0x3f) & 1) != 0);
        if (uVar10 < 4) {
          local_88[uVar10 * 2] = (int *)text;
          local_88[uVar10 * 2 + 1] = (int *)pbVar12;
        }
        text = (char *)(pbVar8 + (bVar4 != 0));
        uVar7 = uVar10 + 1;
      } while (bVar4 == 0x3a);
      text = (char *)(pbVar8 + (bVar4 != 0));
      if (uVar10 < 3) {
        memset(local_88 + uVar10 * 2 + 2,0,uVar10 * -0x10 + 0x30);
      }
      if (local_88[2] < local_88[3]) {
        id = L'\0';
        pbVar8 = (byte *)local_88[2];
        do {
          bVar4 = *pbVar8;
          if ((byte)(bVar4 - 0x3a) < 0xf6) goto LAB_0048fb3e;
          wVar5 = L'\x7fffffff';
          if ((id < L'\x0ccccccd') && ((id != L'\x0ccccccc' || (bVar4 < 0x38)))) {
            wVar5 = (uint)bVar4 + id * 10 + L'\xffffffd0';
          }
          id = wVar5;
          pbVar8 = pbVar8 + 1;
        } while (pbVar8 != (byte *)local_88[3]);
      }
      else {
LAB_0048fb3e:
        id = L'\xffffffff';
      }
      if (2 < uVar10 && id == L'\xffffffff') {
        if (local_88[6] < local_88[7]) {
          pbVar8 = (byte *)local_88[6];
          wVar5 = L'\0';
          do {
            bVar4 = *pbVar8;
            if ((byte)(bVar4 - 0x3a) < 0xf6) goto LAB_0048fba0;
            id = L'\x7fffffff';
            if ((wVar5 < L'\x0ccccccd') && ((wVar5 != L'\x0ccccccc' || (bVar4 < 0x38)))) {
              id = (uint)bVar4 + wVar5 * 10 + L'\xffffffd0';
            }
            pbVar8 = pbVar8 + 1;
            wVar5 = id;
          } while (pbVar8 != (byte *)local_88[7]);
        }
        else {
LAB_0048fba0:
          id = L'\xffffffff';
        }
      }
      local_94 = local_a0;
      if ((7 < (long)local_88[1] - (long)local_88[0]) &&
         (*(int *)((long)local_88[0] + 3) == 0x746c7561 && *local_88[0] == 0x61666564)) {
        local_88[0] = (int *)((long)local_88[0] + 7);
        local_94 = L'Ȁ';
      }
      wVar5 = L'\xffffffec';
      if (local_88[0] == local_88[1]) {
        return L'\xffffffec';
      }
      cVar1 = (char)*local_88[0];
      iVar11 = (int)uVar10;
      switch((byte)(cVar1 + 0x99U) >> 1 | (cVar1 + 0x99U) * -0x80) {
      case 0:
switchD_0048fc12_caseD_0:
        piVar13 = (int *)((long)local_88[0] + 1);
        pcVar14 = "roup";
        do {
          if (local_88[1] <= piVar13) break;
          iVar3 = *piVar13;
          piVar13 = (int *)((long)piVar13 + 1);
          cVar2 = *pcVar14;
          pcVar14 = pcVar14 + 1;
        } while ((char)iVar3 == cVar2);
        if (local_88[1] <= piVar13) {
          local_b0 = (byte *)local_88[2];
          local_a8 = (byte *)local_88[3];
          wVar5 = ismode((char *)local_88[4],(char *)local_88[5],&local_b4);
          if (wVar5 == L'\0') {
            return L'\xffffffec';
          }
          if ((local_b0 < local_a8) || (id != L'\xffffffff')) {
            local_98 = L'✓';
            goto LAB_0048fe4c;
          }
          local_98 = L'✔';
          goto LAB_0048fe3a;
        }
        if (cVar1 != 'm') {
          if (cVar1 != 'o') {
            return L'\xffffffec';
          }
          goto switchD_0048fc12_caseD_4;
        }
      case 3:
switchD_0048fc12_caseD_3:
        piVar13 = (int *)((long)local_88[0] + 1);
        pcVar14 = "mask";
        do {
          pcVar14 = pcVar14 + 1;
          if (local_88[1] <= piVar13) break;
          iVar3 = *piVar13;
          piVar13 = (int *)((long)piVar13 + 1);
        } while ((char)iVar3 == *pcVar14);
        if (piVar13 < local_88[1]) {
          return L'\xffffffec';
        }
        if (iVar11 == 2) {
          if (local_88[2] != local_88[3]) {
            return L'\xffffffec';
          }
          pbVar8 = (byte *)local_88[5];
          pbVar15 = (byte *)local_88[4];
          if (local_88[5] <= local_88[4]) {
            return L'\xffffffec';
          }
        }
        else {
          if (iVar11 != 1) {
            return L'\xffffffec';
          }
          pbVar8 = (byte *)local_88[3];
          pbVar15 = (byte *)local_88[2];
          if (local_88[3] <= local_88[2]) {
            return L'\xffffffec';
          }
        }
        wVar5 = ismode((char *)pbVar15,(char *)pbVar8,&local_b4);
        if (wVar5 == L'\0') {
          return L'\xffffffec';
        }
        local_98 = L'✕';
LAB_0048fe3a:
        local_a8 = (byte *)0x0;
        local_b0 = (byte *)0x0;
LAB_0048fe4c:
        acl_00 = local_38;
        wVar5 = local_94;
        local_9c = local_b4;
        wVar6 = acl_special(local_38,local_94,local_b4,local_98);
        if (wVar6 != L'\0') {
          paVar9 = acl_new_entry(acl_00,wVar5,local_9c,local_98,id);
          if (paVar9 == (archive_acl_entry *)0x0) {
            return L'\xffffffe7';
          }
          if (((local_b0 == (byte *)0x0) || (local_a8 == local_b0)) || (*local_b0 == 0)) {
            archive_mstring_clean(&paVar9->name);
          }
          else {
            wVar5 = archive_mstring_copy_mbs_len_l
                              (&paVar9->name,(char *)local_b0,(long)local_a8 - (long)local_b0,
                               local_40);
            if (wVar5 != L'\0') {
              piVar13 = __errno_location();
              local_90 = 0xffffffec;
              if (*piVar13 == 0xc) {
                return L'\xffffffe2';
              }
            }
          }
        }
        if (*text == 0) {
          return (wchar_t)local_90;
        }
        break;
      default:
        goto switchD_0048fc12_caseD_1;
      case 4:
switchD_0048fc12_caseD_4:
        piVar13 = (int *)((long)local_88[0] + 1);
        pcVar14 = "other";
        do {
          pcVar14 = pcVar14 + 1;
          if (local_88[1] <= piVar13) break;
          iVar3 = *piVar13;
          piVar13 = (int *)((long)piVar13 + 1);
        } while ((char)iVar3 == *pcVar14);
        if (piVar13 < local_88[1]) {
          if (cVar1 != 'm') {
            return L'\xffffffec';
          }
          goto switchD_0048fc12_caseD_3;
        }
        if (iVar11 == 2) {
          if (local_88[2] != local_88[3]) {
            return L'\xffffffec';
          }
          pbVar8 = (byte *)local_88[5];
          pbVar15 = (byte *)local_88[4];
          if (local_88[5] <= local_88[4]) {
            return L'\xffffffec';
          }
        }
        else {
          if (iVar11 != 1) {
            return L'\xffffffec';
          }
          pbVar8 = (byte *)local_88[3];
          pbVar15 = (byte *)local_88[2];
          if (local_88[3] <= local_88[2]) {
            return L'\xffffffec';
          }
        }
        wVar5 = ismode((char *)pbVar15,(char *)pbVar8,&local_b4);
        if (wVar5 == L'\0') {
          return L'\xffffffec';
        }
        local_98 = L'✖';
        goto LAB_0048fe3a;
      case 7:
        piVar13 = (int *)((long)local_88[0] + 1);
        pcVar14 = "ser";
        do {
          if (local_88[1] <= piVar13) break;
          iVar3 = *piVar13;
          piVar13 = (int *)((long)piVar13 + 1);
          cVar2 = *pcVar14;
          pcVar14 = pcVar14 + 1;
        } while ((char)iVar3 == cVar2);
        if (piVar13 < local_88[1]) {
          if (cVar1 == 'o') goto switchD_0048fc12_caseD_4;
          if (cVar1 == 'm') goto switchD_0048fc12_caseD_3;
          if (cVar1 == 'g') goto switchD_0048fc12_caseD_0;
        }
        else {
          local_b0 = (byte *)local_88[2];
          local_a8 = (byte *)local_88[3];
          wVar6 = ismode((char *)local_88[4],(char *)local_88[5],&local_b4);
          if (wVar6 != L'\0') {
            if ((local_a8 <= local_b0) && (id == L'\xffffffff')) {
              local_98 = L'✒';
              goto LAB_0048fe3a;
            }
            local_98 = L'✑';
            goto LAB_0048fe4c;
          }
        }
        goto switchD_0048fc12_caseD_1;
      }
    } while( true );
  }
switchD_0048fc12_caseD_1:
  return wVar5;
}

Assistant:

int
archive_acl_parse_l(struct archive_acl *acl,
    const char *text, int default_type, struct archive_string_conv *sc)
{
	struct {
		const char *start;
		const char *end;
	} field[4], name;

	int fields, n, r, ret = ARCHIVE_OK;
	int type, tag, permset, id;
	char sep;

	while (text != NULL  &&  *text != '\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const char *start, *end;
			next_field(&text, &start, &end, &sep);
			if (fields < 4) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == ':');

		/* Set remaining fields to blank. */
		for (n = fields; n < 4; ++n)
			field[n].start = field[n].end = NULL;

		/* Check for a numeric ID in field 1 or 3. */
		id = -1;
		isint(field[1].start, field[1].end, &id);
		/* Field 3 is optional. */
		if (id == -1 && fields > 3)
			isint(field[3].start, field[3].end, &id);

		/*
		 * Solaris extension:  "defaultuser::rwx" is the
		 * default ACL corresponding to "user::rwx", etc.
		 */
		if (field[0].end - field[0].start > 7
		    && memcmp(field[0].start, "default", 7) == 0) {
			type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
			field[0].start += 7;
		} else
			type = default_type;

		name.start = name.end = NULL;
		if (prefix_c(field[0].start, field[0].end, "user")) {
			if (!ismode(field[2].start, field[2].end, &permset))
				return (ARCHIVE_WARN);
			if (id != -1 || field[1].start < field[1].end) {
				tag = ARCHIVE_ENTRY_ACL_USER;
				name = field[1];
			} else
				tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
		} else if (prefix_c(field[0].start, field[0].end, "group")) {
			if (!ismode(field[2].start, field[2].end, &permset))
				return (ARCHIVE_WARN);
			if (id != -1 || field[1].start < field[1].end) {
				tag = ARCHIVE_ENTRY_ACL_GROUP;
				name = field[1];
			} else
				tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
		} else if (prefix_c(field[0].start, field[0].end, "other")) {
			if (fields == 2
			    && field[1].start < field[1].end
			    && ismode(field[1].start, field[1].end, &permset)) {
				/* This is Solaris-style "other:rwx" */
			} else if (fields == 3
			    && field[1].start == field[1].end
			    && field[2].start < field[2].end
			    && ismode(field[2].start, field[2].end, &permset)) {
				/* This is FreeBSD-style "other::rwx" */
			} else
				return (ARCHIVE_WARN);
			tag = ARCHIVE_ENTRY_ACL_OTHER;
		} else if (prefix_c(field[0].start, field[0].end, "mask")) {
			if (fields == 2
			    && field[1].start < field[1].end
			    && ismode(field[1].start, field[1].end, &permset)) {
				/* This is Solaris-style "mask:rwx" */
			} else if (fields == 3
			    && field[1].start == field[1].end
			    && field[2].start < field[2].end
			    && ismode(field[2].start, field[2].end, &permset)) {
				/* This is FreeBSD-style "mask::rwx" */
			} else
				return (ARCHIVE_WARN);
			tag = ARCHIVE_ENTRY_ACL_MASK;
		} else
			return (ARCHIVE_WARN);

		/* Add entry to the internal list. */
		r = archive_acl_add_entry_len_l(acl, type, permset,
		    tag, id, name.start, name.end - name.start, sc);
		if (r < ARCHIVE_WARN)
			return (r);
		if (r != ARCHIVE_OK)
			ret = ARCHIVE_WARN;
	}
	return (ret);
}